

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ostream.h
# Opt level: O0

WifiDebugOstream * operator<<(WifiDebugOstream *sink,int i)

{
  uint local_14;
  int i_local;
  WifiDebugOstream *sink_local;
  
  local_14 = i;
  if (i < 0) {
    operator<<(sink,"-");
    local_14 = -i;
  }
  operator<<(sink,local_14);
  return sink;
}

Assistant:

T& operator<<( T& sink, int i )
{
  // Handle -
  if ( i < 0 )
  {
    sink << "-";   
    i = -i;
  }

  sink << (unsigned int) i;
  return sink;
}